

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

tuple<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
 __thiscall
pstore::command_line::details::
parse_option_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::ostringstream>
          (details *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first_arg,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          last_arg,string *program_name,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  bool bVar1;
  uint uVar2;
  reference pbVar3;
  option **ppoVar4;
  string *psVar5;
  ostream *poVar6;
  czstring pcVar7;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  extraout_RDX;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs_00;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  tuple<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  tVar8;
  maybe<pstore::command_line::option_*,_void> local_1d0;
  string local_1c0 [32];
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> local_1a0;
  maybe<pstore::command_line::option_*,_void> local_188;
  maybe<pstore::command_line::option_*,_void> local_178;
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> local_168;
  maybe<pstore::command_line::option_*,_void> local_150;
  undefined1 local_140 [16];
  string local_130;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_110;
  int local_c4;
  maybe<pstore::command_line::option_*,_void> local_c0;
  maybe<pstore::command_line::option_*,_void> local_b0 [2];
  undefined1 local_90 [8];
  string arg_name;
  undefined1 local_68 [7];
  sticky_bool<false> ok;
  maybe<pstore::command_line::option_*,_void> handler;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs_local;
  string *program_name_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last_arg_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first_arg_local;
  
  errs_00 = errs;
  program_name_local = last_arg._M_current;
  last_arg_local = first_arg;
  nothing<std::__cxx11::string>();
  nothing<pstore::command_line::option*>();
  sticky_bool<false>::sticky_bool((sticky_bool<false> *)(arg_name.field_2._M_local_buf + 0xf),true);
  while (bVar1 = __gnu_cxx::operator!=
                           (&last_arg_local,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program_name_local), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&last_arg_local);
    std::__cxx11::string::string((string *)local_90,(string *)pbVar3);
    maybe<pstore::command_line::option_*,_void>::maybe
              (local_b0,(maybe<pstore::command_line::option_*,_void> *)local_68);
    bVar1 = handler_takes_argument(local_b0);
    maybe<pstore::command_line::option_*,_void>::~maybe(local_b0);
    if (bVar1) {
      maybe<pstore::command_line::option_*,_void>::maybe
                (&local_c0,(maybe<pstore::command_line::option_*,_void> *)local_68);
      bVar1 = handler_set_value(&local_c0,(string *)local_90);
      sticky_bool<false>::operator=
                ((sticky_bool<false> *)(arg_name.field_2._M_local_buf + 0xf),bVar1);
      maybe<pstore::command_line::option_*,_void>::~maybe(&local_c0);
      maybe<pstore::command_line::option_*,_void>::reset
                ((maybe<pstore::command_line::option_*,_void> *)local_68);
      local_c4 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"--");
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&last_arg_local);
        local_c4 = 2;
      }
      else {
        bVar1 = argument_is_positional((string *)local_90);
        if (bVar1) {
          local_c4 = 2;
        }
        else {
          bVar1 = starts_with((string *)local_90,"--");
          if (bVar1) {
            std::__cxx11::string::string((string *)(local_140 + 0x10),(string *)local_90);
            get_option_and_value(&local_110,(string *)(local_140 + 0x10));
            std::tie<std::__cxx11::string,pstore::maybe<std::__cxx11::string,void>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,
                       (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)local_90);
            std::tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&>::operator=
                      ((tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&> *)
                       local_140,&local_110);
            std::
            tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
            ::~tuple(&local_110);
            std::__cxx11::string::~string((string *)(local_140 + 0x10));
            find_handler(&local_150,(string *)local_90);
            maybe<pstore::command_line::option_*,_void>::operator=
                      ((maybe<pstore::command_line::option_*,_void> *)local_68,&local_150);
            maybe<pstore::command_line::option_*,_void>::~maybe(&local_150);
            bVar1 = maybe::operator_cast_to_bool((maybe *)local_68);
            if (bVar1) {
              ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                                  ((maybe<pstore::command_line::option_*,_void> *)local_68);
              uVar2 = (*(*ppoVar4)->_vptr_option[9])();
              if ((uVar2 & 1) == 0) {
                maybe<pstore::command_line::option_*,_void>::maybe
                          (&local_178,(maybe<pstore::command_line::option_*,_void> *)local_68);
                errs_00 = errs;
                record_value_if_available<std::__cxx11::ostringstream>
                          (&local_168,(details *)&local_178,
                           (maybe<pstore::command_line::option_*,_void> *)&handler.storage_.__align,
                           (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                            *)program_name,(string *)errs,in_R9);
                std::
                tie<pstore::maybe<pstore::command_line::option*,void>,pstore::command_line::details::sticky_bool<false>>
                          (&local_188,(sticky_bool<false> *)local_68);
                std::
                tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                ::operator=((tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                             *)&local_188,&local_168);
                std::tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool>::~tuple
                          (&local_168);
                maybe<pstore::command_line::option_*,_void>::~maybe(&local_178);
                goto LAB_001680c0;
              }
            }
            report_unknown_option<std::__cxx11::ostringstream>
                      (program_name,(string *)local_90,
                       (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)&handler.storage_.__align,errs);
            sticky_bool<false>::operator=
                      ((sticky_bool<false> *)(arg_name.field_2._M_local_buf + 0xf),false);
            local_c4 = 4;
          }
          else {
            std::__cxx11::string::string(local_1c0,(string *)local_90);
            process_single_dash<std::__cxx11::ostringstream>
                      (&local_1a0,(details *)local_1c0,program_name,(string *)errs,errs_00);
            std::
            tie<pstore::maybe<pstore::command_line::option*,void>,pstore::command_line::details::sticky_bool<false>>
                      (&local_1d0,(sticky_bool<false> *)local_68);
            std::
            tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
            ::operator=((tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                         *)&local_1d0,&local_1a0);
            std::tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool>::~tuple
                      (&local_1a0);
            std::__cxx11::string::~string(local_1c0);
LAB_001680c0:
            local_c4 = 0;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_90);
    if ((local_c4 != 0) && (local_c4 == 2)) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&last_arg_local);
  }
  bVar1 = maybe::operator_cast_to_bool((maybe *)local_68);
  if (bVar1) {
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                        ((maybe<pstore::command_line::option_*,_void> *)local_68);
    uVar2 = (*(*ppoVar4)->_vptr_option[0xe])();
    if ((uVar2 & 1) != 0) {
      psVar5 = stream_trait<char>::out_string(program_name);
      poVar6 = std::operator<<((ostream *)errs,(string *)psVar5);
      pcVar7 = stream_trait<char>::out_text(": Argument \'");
      poVar6 = std::operator<<(poVar6,pcVar7);
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                          ((maybe<pstore::command_line::option_*,_void> *)local_68);
      psVar5 = option::name_abi_cxx11_(*ppoVar4);
      psVar5 = stream_trait<char>::out_string(psVar5);
      poVar6 = std::operator<<(poVar6,(string *)psVar5);
      pcVar7 = stream_trait<char>::out_text("\' requires a value\n");
      std::operator<<(poVar6,pcVar7);
      sticky_bool<false>::operator=
                ((sticky_bool<false> *)(arg_name.field_2._M_local_buf + 0xf),false);
    }
  }
  sticky_bool::operator_cast_to_bool((sticky_bool *)(arg_name.field_2._M_local_buf + 0xf));
  std::
  make_tuple<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,bool>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,(bool *)&last_arg_local);
  local_c4 = 1;
  maybe<pstore::command_line::option_*,_void>::~maybe
            ((maybe<pstore::command_line::option_*,_void> *)local_68);
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  ~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)&handler.storage_.__align);
  tVar8.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  ._M_head_impl._M_current = extraout_RDX._M_head_impl._M_current;
  tVar8.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  ._0_8_ = this;
  return (tuple<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
          )tVar8.
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  ;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }